

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

BrotliDecoderErrorCode
duckdb_brotli::DecodeMetaBlockLength(BrotliDecoderStateInternal *s,BrotliBitReader *br)

{
  bool bVar1;
  ulong *in_RSI;
  long in_RDI;
  int i;
  uint64_t bits;
  int local_4e4;
  ulong local_4e0;
  
  do {
    switch(*(undefined4 *)(in_RDI + 0x2f0)) {
    case 0:
      while (in_RSI[1] == 0) {
        if (in_RSI[2] == in_RSI[4]) {
          bVar1 = false;
          goto LAB_023d87ee;
        }
        *in_RSI = *in_RSI | (ulong)*(byte *)in_RSI[2] << ((byte)in_RSI[1] & 0x3f);
        in_RSI[1] = in_RSI[1] + 8;
        in_RSI[2] = in_RSI[2] + 1;
      }
      local_4e0 = *in_RSI & 1;
      in_RSI[1] = in_RSI[1] - 1;
      *in_RSI = *in_RSI >> 1;
      bVar1 = true;
LAB_023d87ee:
      if (!bVar1) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      *(uint *)(in_RDI + 0x304) = *(uint *)(in_RDI + 0x304) & 0xfffffffe | (uint)(local_4e0 != 0);
      *(undefined4 *)(in_RDI + 0x84) = 0;
      *(uint *)(in_RDI + 0x304) = *(uint *)(in_RDI + 0x304) & 0xfffffffd;
      *(uint *)(in_RDI + 0x304) = *(uint *)(in_RDI + 0x304) & 0xfffffffb;
      if ((*(uint *)(in_RDI + 0x304) & 1) == 0) {
        *(undefined4 *)(in_RDI + 0x2f0) = 2;
        break;
      }
      *(undefined4 *)(in_RDI + 0x2f0) = 1;
    case 1:
      while (in_RSI[1] == 0) {
        if (in_RSI[2] == in_RSI[4]) {
          bVar1 = false;
          goto LAB_023d8af4;
        }
        *in_RSI = *in_RSI | (ulong)*(byte *)in_RSI[2] << ((byte)in_RSI[1] & 0x3f);
        in_RSI[1] = in_RSI[1] + 8;
        in_RSI[2] = in_RSI[2] + 1;
      }
      local_4e0 = *in_RSI & 1;
      in_RSI[1] = in_RSI[1] - 1;
      *in_RSI = *in_RSI >> 1;
      bVar1 = true;
LAB_023d8af4:
      if (!bVar1) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (local_4e0 != 0) {
        *(undefined4 *)(in_RDI + 0x2f0) = 0;
        return BROTLI_DECODER_SUCCESS;
      }
      *(undefined4 *)(in_RDI + 0x2f0) = 2;
switchD_023d859c_caseD_2:
      while (in_RSI[1] < 2) {
        if (in_RSI[2] == in_RSI[4]) {
          bVar1 = false;
          goto LAB_023d8d8e;
        }
        *in_RSI = *in_RSI | (ulong)*(byte *)in_RSI[2] << ((byte)in_RSI[1] & 0x3f);
        in_RSI[1] = in_RSI[1] + 8;
        in_RSI[2] = in_RSI[2] + 1;
      }
      local_4e0 = *in_RSI & 3;
      in_RSI[1] = in_RSI[1] - 2;
      *in_RSI = *in_RSI >> 2;
      bVar1 = true;
LAB_023d8d8e:
      if (!bVar1) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      *(uint *)(in_RDI + 0x304) =
           *(uint *)(in_RDI + 0x304) & 0xfff00fff | (uint)(byte)((char)local_4e0 + 4) << 0xc;
      *(undefined4 *)(in_RDI + 4) = 0;
      if (local_4e0 != 3) {
        *(undefined4 *)(in_RDI + 0x2f0) = 3;
        goto switchD_023d859c_caseD_3;
      }
      *(uint *)(in_RDI + 0x304) = *(uint *)(in_RDI + 0x304) & 0xfffffffb | 4;
      *(undefined4 *)(in_RDI + 0x2f0) = 5;
      break;
    case 2:
      goto switchD_023d859c_caseD_2;
    case 3:
      goto switchD_023d859c_caseD_3;
    case 4:
      goto switchD_023d859c_caseD_4;
    case 5:
      goto LAB_023d944b;
    case 6:
      goto switchD_023d859c_caseD_6;
    case 7:
      goto switchD_023d859c_caseD_7;
    default:
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
  } while( true );
LAB_023d944b:
  if (in_RSI[1] != 0) goto LAB_023d957d;
  if (in_RSI[2] == in_RSI[4]) {
    bVar1 = false;
    goto LAB_023d966c;
  }
  *in_RSI = *in_RSI | (ulong)*(byte *)in_RSI[2] << ((byte)in_RSI[1] & 0x3f);
  in_RSI[1] = in_RSI[1] + 8;
  in_RSI[2] = in_RSI[2] + 1;
  goto LAB_023d944b;
LAB_023d957d:
  local_4e0 = *in_RSI & 1;
  in_RSI[1] = in_RSI[1] - 1;
  *in_RSI = *in_RSI >> 1;
  bVar1 = true;
LAB_023d966c:
  if (!bVar1) {
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  if (local_4e0 != 0) {
    return BROTLI_DECODER_ERROR_FORMAT_RESERVED;
  }
  *(undefined4 *)(in_RDI + 0x2f0) = 6;
switchD_023d859c_caseD_6:
  do {
    if (1 < in_RSI[1]) {
      local_4e0 = *in_RSI & 3;
      in_RSI[1] = in_RSI[1] - 2;
      *in_RSI = *in_RSI >> 2;
      bVar1 = true;
LAB_023d98d6:
      if (!bVar1) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (local_4e0 == 0) {
        *(undefined4 *)(in_RDI + 0x2f0) = 0;
        return BROTLI_DECODER_SUCCESS;
      }
      *(uint *)(in_RDI + 0x304) =
           *(uint *)(in_RDI + 0x304) & 0xfff00fff | ((uint)local_4e0 & 0xff) << 0xc;
      *(undefined4 *)(in_RDI + 0x2f0) = 7;
switchD_023d859c_caseD_7:
      local_4e4 = *(int *)(in_RDI + 4);
      do {
        if ((int)(*(uint *)(in_RDI + 0x304) >> 0xc & 0xff) <= local_4e4) {
          *(int *)(in_RDI + 0x84) = *(int *)(in_RDI + 0x84) + 1;
          *(undefined4 *)(in_RDI + 0x2f0) = 0;
          return BROTLI_DECODER_SUCCESS;
        }
        while (in_RSI[1] < 8) {
          if (in_RSI[2] == in_RSI[4]) {
            bVar1 = false;
            goto LAB_023d9ba2;
          }
          *in_RSI = *in_RSI | (ulong)*(byte *)in_RSI[2] << ((byte)in_RSI[1] & 0x3f);
          in_RSI[1] = in_RSI[1] + 8;
          in_RSI[2] = in_RSI[2] + 1;
        }
        local_4e0 = *in_RSI & 0xff;
        in_RSI[1] = in_RSI[1] - 8;
        *in_RSI = *in_RSI >> 8;
        bVar1 = true;
LAB_023d9ba2:
        if (!bVar1) {
          *(int *)(in_RDI + 4) = local_4e4;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (((local_4e4 + 1U == (*(uint *)(in_RDI + 0x304) >> 0xc & 0xff)) &&
            (1 < (*(uint *)(in_RDI + 0x304) >> 0xc & 0xff))) && (local_4e0 == 0)) {
          return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE;
        }
        *(uint *)(in_RDI + 0x84) =
             (uint)(local_4e0 << ((byte)(local_4e4 << 3) & 0x3f)) | *(uint *)(in_RDI + 0x84);
        local_4e4 = local_4e4 + 1;
      } while( true );
    }
    if (in_RSI[2] == in_RSI[4]) {
      bVar1 = false;
      goto LAB_023d98d6;
    }
    *in_RSI = *in_RSI | (ulong)*(byte *)in_RSI[2] << ((byte)in_RSI[1] & 0x3f);
    in_RSI[1] = in_RSI[1] + 8;
    in_RSI[2] = in_RSI[2] + 1;
  } while( true );
switchD_023d859c_caseD_3:
  for (local_4e4 = *(int *)(in_RDI + 4); local_4e4 < (int)(*(uint *)(in_RDI + 0x304) >> 0xc & 0xff);
      local_4e4 = local_4e4 + 1) {
    while (in_RSI[1] < 4) {
      if (in_RSI[2] == in_RSI[4]) {
        bVar1 = false;
        goto LAB_023d909d;
      }
      *in_RSI = *in_RSI | (ulong)*(byte *)in_RSI[2] << ((byte)in_RSI[1] & 0x3f);
      in_RSI[1] = in_RSI[1] + 8;
      in_RSI[2] = in_RSI[2] + 1;
    }
    local_4e0 = *in_RSI & 0xf;
    in_RSI[1] = in_RSI[1] - 4;
    *in_RSI = *in_RSI >> 4;
    bVar1 = true;
LAB_023d909d:
    if (!bVar1) {
      *(int *)(in_RDI + 4) = local_4e4;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    if (((local_4e4 + 1U == (*(uint *)(in_RDI + 0x304) >> 0xc & 0xff)) &&
        (4 < (*(uint *)(in_RDI + 0x304) >> 0xc & 0xff))) && (local_4e0 == 0)) {
      return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE;
    }
    *(uint *)(in_RDI + 0x84) =
         (uint)(local_4e0 << ((byte)(local_4e4 << 2) & 0x3f)) | *(uint *)(in_RDI + 0x84);
  }
  *(undefined4 *)(in_RDI + 0x2f0) = 4;
switchD_023d859c_caseD_4:
  if ((*(uint *)(in_RDI + 0x304) & 1) == 0) {
    while (in_RSI[1] == 0) {
      if (in_RSI[2] == in_RSI[4]) {
        bVar1 = false;
        goto LAB_023d93b6;
      }
      *in_RSI = *in_RSI | (ulong)*(byte *)in_RSI[2] << ((byte)in_RSI[1] & 0x3f);
      in_RSI[1] = in_RSI[1] + 8;
      in_RSI[2] = in_RSI[2] + 1;
    }
    local_4e0 = *in_RSI & 1;
    in_RSI[1] = in_RSI[1] - 1;
    *in_RSI = *in_RSI >> 1;
    bVar1 = true;
LAB_023d93b6:
    if (!bVar1) {
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    *(uint *)(in_RDI + 0x304) = *(uint *)(in_RDI + 0x304) & 0xfffffffd | (uint)(local_4e0 != 0) << 1
    ;
  }
  *(int *)(in_RDI + 0x84) = *(int *)(in_RDI + 0x84) + 1;
  *(undefined4 *)(in_RDI + 0x2f0) = 0;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE DecodeMetaBlockLength(BrotliDecoderState *s, BrotliBitReader *br) {
	brotli_reg_t bits;
	int i;
	for (;;) {
		switch (s->substate_metablock_header) {
		case BROTLI_STATE_METABLOCK_HEADER_NONE:
			if (!BrotliSafeReadBits(br, 1, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			s->is_last_metablock = bits ? 1 : 0;
			s->meta_block_remaining_len = 0;
			s->is_uncompressed = 0;
			s->is_metadata = 0;
			if (!s->is_last_metablock) {
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
				break;
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
			if (!BrotliSafeReadBits(br, 1, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			if (bits) {
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
				return BROTLI_DECODER_SUCCESS;
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
			if (!BrotliSafeReadBits(br, 2, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			s->size_nibbles = (uint8_t)(bits + 4);
			s->loop_counter = 0;
			if (bits == 3) {
				s->is_metadata = 1;
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
				break;
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_SIZE:
			i = s->loop_counter;
			for (; i < (int)s->size_nibbles; ++i) {
				if (!BrotliSafeReadBits(br, 4, &bits)) {
					s->loop_counter = i;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				if (i + 1 == (int)s->size_nibbles && s->size_nibbles > 4 && bits == 0) {
					return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE);
				}
				s->meta_block_remaining_len |= (int)(bits << (i * 4));
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
			if (!s->is_last_metablock) {
				if (!BrotliSafeReadBits(br, 1, &bits)) {
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				s->is_uncompressed = bits ? 1 : 0;
			}
			++s->meta_block_remaining_len;
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
			return BROTLI_DECODER_SUCCESS;

		case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
			if (!BrotliSafeReadBits(br, 1, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			if (bits != 0) {
				return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_RESERVED);
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_BYTES:
			if (!BrotliSafeReadBits(br, 2, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			if (bits == 0) {
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
				return BROTLI_DECODER_SUCCESS;
			}
			s->size_nibbles = (uint8_t)bits;
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_METADATA:
			i = s->loop_counter;
			for (; i < (int)s->size_nibbles; ++i) {
				if (!BrotliSafeReadBits(br, 8, &bits)) {
					s->loop_counter = i;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				if (i + 1 == (int)s->size_nibbles && s->size_nibbles > 1 && bits == 0) {
					return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE);
				}
				s->meta_block_remaining_len |= (int)(bits << (i * 8));
			}
			++s->meta_block_remaining_len;
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
			return BROTLI_DECODER_SUCCESS;

		default:
			return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
		}
	}
}